

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O2

void __thiscall DMovingFloor::DMovingFloor(DMovingFloor *this,sector_t_conflict *sector)

{
  DInterpolation *pDVar1;
  
  DMover::DMover(&this->super_DMover,sector);
  (this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006eed68;
  (sector->floordata).field_0.p = (DSectorEffect *)this;
  pDVar1 = sector_t::SetInterpolation((sector_t *)sector,1,true);
  (this->super_DMover).interpolation.field_0.p = pDVar1;
  return;
}

Assistant:

DMovingFloor::DMovingFloor (sector_t *sector)
	: DMover (sector)
{
	sector->floordata = this;
	interpolation = sector->SetInterpolation(sector_t::FloorMove, true);
}